

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_close_children(lws *wsi,int reason)

{
  lws *plVar1;
  lws **pplVar2;
  lws_log_cx *cx;
  lws **w;
  lws *wsi2;
  int reason_local;
  lws *wsi_local;
  
  if ((wsi->mux).child_list != (lws *)0x0) {
    pplVar2 = &(wsi->mux).child_list;
    while (*pplVar2 != (lws *)0x0) {
      cx = lwsl_wsi_get_cx(*pplVar2);
      _lws_log_cx(cx,lws_log_prepend_wsi,*pplVar2,8,"lws_wsi_mux_close_children","   closing child")
      ;
      plVar1 = ((*pplVar2)->mux).sibling_list;
      if (plVar1 == *pplVar2) {
        __assert_fail("wsi2 != *w",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                      ,0x57f,"void lws_wsi_mux_close_children(struct lws *, int)");
      }
      ((*pplVar2)->mux).sibling_list = (lws *)0x0;
      *(ulong *)&(*pplVar2)->field_0x46e =
           *(ulong *)&(*pplVar2)->field_0x46e & 0xffffffffffffefff | 0x1000;
      __lws_close_free_wsi(*pplVar2,reason,"mux child recurse");
      *pplVar2 = plVar1;
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_close_children(struct lws *wsi, int reason)
{
	struct lws *wsi2;
	struct lws **w;

	if (!wsi->mux.child_list)
		return;

	w = &wsi->mux.child_list;
	while (*w) {
		lwsl_wsi_info((*w), "   closing child");
		/* disconnect from siblings */
		wsi2 = (*w)->mux.sibling_list;
		assert (wsi2 != *w);
		(*w)->mux.sibling_list = NULL;
		(*w)->socket_is_permanently_unusable = 1;
		__lws_close_free_wsi(*w, (enum lws_close_status)reason, "mux child recurse");
		*w = wsi2;
	}
}